

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin2cpp.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  ostream *poVar5;
  string local_4e8 [8];
  fstream outfile;
  allocator<char> local_2d1;
  undefined1 local_2d0 [8];
  string filename;
  fstream local_2a8 [8];
  fstream file;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  string filen;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string arg_x;
  char **argv_local;
  int argc_local;
  
  arg_x.field_2._8_8_ = argv;
  if (argc != 4) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error requires two arguments.\n");
    poVar5 = std::operator<<(poVar5,*(char **)arg_x.field_2._8_8_);
    std::operator<<(poVar5," binarysource outputfile lang\nlang is either c or cpp\n");
    exit(1);
  }
  pcVar1 = argv[3];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,pcVar1,&local_39);
  std::allocator<char>::~allocator(&local_39);
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"c");
  if ((((bVar3) &&
       (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"cpp"), bVar3)) &&
      (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_38,"cpp17"), bVar3)) &&
     (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"go"), bVar3)) {
    std::operator<<((ostream *)&std::cerr,
                    "Invalid language selection please use either c or cpp or cpp17 or go\n");
    exit(1);
  }
  pcVar1 = *(char **)(arg_x.field_2._8_8_ + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,pcVar1,&local_91);
  convertFilename((string *)local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::fstream::fstream(local_2a8);
  uVar2 = *(undefined8 *)(arg_x.field_2._8_8_ + 8);
  std::operator|(_S_in,_S_bin);
  std::fstream::open((char *)local_2a8,(_Ios_Openmode)uVar2);
  bVar4 = std::fstream::is_open();
  if ((bVar4 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error opening file: ");
    poVar5 = std::operator<<(poVar5,*(char **)(arg_x.field_2._8_8_ + 8));
    std::operator<<(poVar5,"\n");
    filename.field_2._12_4_ = 1;
  }
  else {
    pcVar1 = *(char **)(arg_x.field_2._8_8_ + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_2d0,pcVar1,&local_2d1);
    std::allocator<char>::~allocator(&local_2d1);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"c");
    if ((bVar3) ||
       (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"cpp"), bVar3)) {
      std::__cxx11::string::operator+=((string *)local_2d0,".h");
    }
    else {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"cpp17");
      if (bVar3) {
        std::__cxx11::string::operator+=((string *)local_2d0,".hpp");
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"go");
        if (bVar3) {
          std::__cxx11::string::operator+=((string *)local_2d0,".go");
        }
      }
    }
    std::fstream::fstream(local_4e8);
    std::fstream::open(local_4e8,(_Ios_Openmode)local_2d0);
    bVar4 = std::fstream::is_open();
    if ((bVar4 & 1) == 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Could not open file: ");
      poVar5 = std::operator<<(poVar5,(string *)local_2d0);
      std::operator<<(poVar5,"\n");
      std::fstream::close();
    }
    else {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"cpp17");
      if (bVar3) {
        outputCpp17((string *)local_2d0,local_2a8,(string *)local_70,(fstream *)local_4e8);
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"c");
        if ((bVar3) ||
           (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_38,"cpp"), bVar3)) {
          outputCpp((string *)local_2d0,local_2a8,(string *)local_70,(fstream *)local_4e8,
                    (string *)local_38,(char **)arg_x.field_2._8_8_);
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_38,"go");
          if (bVar3) {
            outputGo((string *)local_2d0,local_2a8,(string *)local_70,(fstream *)local_4e8);
          }
        }
      }
    }
    filename.field_2._12_4_ = 1;
    std::fstream::~fstream(local_4e8);
    std::__cxx11::string::~string((string *)local_2d0);
  }
  std::fstream::~fstream(local_2a8);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_38);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    if(argc != 4) {
        std::cerr << "Error requires two arguments.\n" << argv[0] << " binarysource outputfile lang\nlang is either c or cpp\n";
        exit(EXIT_FAILURE);
    }
    std::string arg_x = argv[3];
    if(arg_x != "c" && arg_x != "cpp" && arg_x != "cpp17" && arg_x != "go") {
        std::cerr << "Invalid language selection please use either c or cpp or cpp17 or go\n";
        exit(EXIT_FAILURE);
    }
    std::string filen = convertFilename(argv[1]);
    std::fstream file;
    file.open(argv[1], std::ios::in | std::ios::binary);
    if(!file.is_open()) {
        std::cerr << "Error opening file: " << argv[1] << "\n";
        return 0;
    }
    std::string filename=argv[2];
    if(arg_x == "c" || arg_x == "cpp")
    	filename += ".h";
    else if(arg_x == "cpp17")
        filename += ".hpp";
    else if(arg_x == "go")
        filename += ".go";
    
    std::fstream outfile;
    outfile.open(filename, std::ios::out);
    if(!outfile.is_open()) {
        std::cerr << "Could not open file: " << filename << "\n";
        file.close();
        return 0;
    }
    
    if(arg_x == "cpp17") {
        outputCpp17(filename, file, filen, outfile);
    }
    else if(arg_x == "c" || arg_x == "cpp") {
        outputCpp(filename, file, filen, outfile, arg_x, argv);
    }
    else if(arg_x == "go") {
        outputGo(filename, file, filen, outfile);
    }
    return 0;
}